

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O1

Matrix * __thiscall
ANN::feed_forward(Matrix *__return_storage_ptr__,ANN *this,
                 vector<double,_std::allocator<double>_> *inputs)

{
  uint uVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> *inputs_00;
  ulong uVar3;
  pointer pLVar4;
  ulong uVar5;
  uint uVar6;
  Matrix mat;
  Matrix local_b8;
  Matrix local_90;
  Matrix local_70;
  Matrix local_50;
  
  local_b8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Layer::equalize((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_start,inputs);
  pLVar4 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pLVar4;
  if (1 < (ulong)((lVar2 >> 3) * 0x2e8ba2e8ba2e8ba3)) {
    uVar5 = 1;
    uVar6 = 2;
    do {
      uVar1 = uVar6 - 2;
      Layer::outputs(&local_90,pLVar4 + uVar1);
      Matrix::transpose(&local_70,
                        &(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar1].m_weights);
      Matrix::operator*(&local_50,&local_90,&local_70);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_b8.m_vals,&local_50.m_vals);
      local_b8.m_shape.field_0 = local_50.m_shape.field_0;
      Matrix::~Matrix(&local_50);
      Matrix::~Matrix(&local_70);
      Matrix::~Matrix(&local_90);
      Matrix::operator+=(&local_b8,
                         &(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar1].m_biases);
      pLVar4 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      inputs_00 = Matrix::operator[](&local_b8,0);
      Layer::equalize(pLVar4 + uVar5,inputs_00);
      uVar5 = (ulong)uVar6;
      pLVar4 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pLVar4;
      uVar3 = (lVar2 >> 3) * 0x2e8ba2e8ba2e8ba3;
      uVar6 = uVar6 + 1;
    } while (uVar5 <= uVar3 && uVar3 - uVar5 != 0);
  }
  Layer::outputs(__return_storage_ptr__,
                 (Layer *)((long)&pLVar4[-1].m_perceptrons.
                                  super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
                                  _M_impl + lVar2));
  Matrix::~Matrix(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Matrix ANN::feed_forward(const std::vector<double>& inputs){
    Matrix mat;
    m_layers[0].equalize(inputs);

    for(uint i=1;i<m_layers.size();++i){
        mat=m_layers[i-1].outputs()*Matrix::transpose(m_layers[i-1].weights());
        mat+=m_layers[i-1].biases();
        m_layers[i].equalize(mat[0]);
    }

    return m_layers[m_layers.size()-1].outputs();
}